

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

map<int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>_>
* __thiscall
njoy::ENDFtk::file::
Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>_>
           *__return_storage_ptr__,
          Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
          *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  bool bVar1;
  vector<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  sections;
  vector<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  local_618;
  _Variadic_union<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
  local_5f8;
  
  local_618.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = StructureDivision::isSendPermissive((StructureDivision *)this);
    if ((bVar1 && *(int *)(this + 0x34) == 0) && (0 < *(int *)(this + 0x30))) break;
    Type<1>::readSection<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((SectionVariant *)&local_5f8._M_first,(Type<1> *)this,division,begin,end,lineNumber);
    std::
    vector<std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>,std::allocator<std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>>
    ::
    emplace_back<std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
              ((vector<std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>,std::allocator<std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>>
                *)&local_618,
               (variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
                *)&local_5f8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
                         *)&local_5f8._M_first);
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)&local_5f8._M_first,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )*(char **)&(division->base).fields.
                            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<2UL,_long,_long,_long,_long>.
                            super__Tuple_impl<3UL,_long,_long,_long>.
                            super__Tuple_impl<4UL,_long,_long>,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    *(undefined8 *)(this + 0x20) = local_5f8._32_8_;
    *(undefined8 *)(this + 0x28) = local_5f8._40_8_;
    *(undefined8 *)(this + 0x10) = local_5f8._16_8_;
    *(undefined8 *)(this + 0x18) = local_5f8._24_8_;
    *(undefined8 *)this = local_5f8._0_8_;
    *(undefined8 *)(this + 8) = local_5f8._8_8_;
    *(undefined4 *)(this + 0x38) = local_5f8._56_4_;
    *(undefined8 *)(this + 0x30) = local_5f8._48_8_;
  }
  Base<njoy::ENDFtk::file::Type<1>,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>
  ::verifyFEND((StructureDivision *)this,(long)end->_M_current);
  Base<njoy::ENDFtk::file::Type<1>,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>
  ::fill(__return_storage_ptr__,&local_618);
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>
  ::~vector(&local_618);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< Section > sections;
  while ( not division.isFend() ) {

    sections.emplace_back( Derived::readSection( division, begin, end, lineNumber ) );
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyFEND( division, lineNumber );
  return fill( std::move( sections ) );
}